

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O0

void __thiscall VmModule::VmModule(VmModule *this,Allocator *allocator,char *code)

{
  char *code_local;
  Allocator *allocator_local;
  VmModule *this_local;
  
  this->code = code;
  IntrusiveList<VmFunction>::IntrusiveList(&this->functions);
  SmallArray<VmModule::LoopInfo,_32U>::SmallArray(&this->loopInfo,allocator);
  SmallArray<VmModule::LoadStoreInfo,_32U>::SmallArray(&this->loadStoreInfo,allocator);
  SmallArray<VmValue_*,_128U>::SmallArray(&this->tempUsers,allocator);
  SmallArray<VmInstruction_*,_128U>::SmallArray(&this->tempInstructions,allocator);
  this->allocator = allocator;
  this->vmGlobalCodeStart = 0;
  this->regVmGlobalCodeStart = 0;
  this->skipFunctionDefinitions = false;
  this->currentFunction = (VmFunction *)0x0;
  this->currentBlock = (VmBlock *)0x0;
  this->peepholeOptimizations = 0;
  this->constantPropagations = 0;
  this->deadCodeEliminations = 0;
  this->controlFlowSimplifications = 0;
  this->loadStorePropagations = 0;
  this->commonSubexprEliminations = 0;
  this->deadAllocaStoreEliminations = 0;
  this->functionInlines = 0;
  return;
}

Assistant:

VmModule(Allocator *allocator, const char *code): code(code), loopInfo(allocator), loadStoreInfo(allocator), tempUsers(allocator), tempInstructions(allocator), allocator(allocator)
	{
		vmGlobalCodeStart = 0;
		regVmGlobalCodeStart = 0;

		skipFunctionDefinitions = false;

		currentFunction = NULL;
		currentBlock = NULL;

		peepholeOptimizations = 0;
		constantPropagations = 0;
		deadCodeEliminations = 0;
		controlFlowSimplifications = 0;
		loadStorePropagations = 0;
		commonSubexprEliminations = 0;
		deadAllocaStoreEliminations = 0;
		functionInlines = 0;
	}